

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O3

EnumValue *
cppwinrt::get_attribute_value<winmd::reader::ElemSig::EnumValue>
          (EnumValue *__return_storage_ptr__,CustomAttribute *attribute,uint32_t arg)

{
  table_base *ptVar1;
  undefined8 uVar2;
  undefined7 uVar3;
  uint32_t uVar4;
  undefined4 uVar5;
  variant<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
  *__v;
  variant_alternative_t<14UL,_variant<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_basic_string_view<char,_char_traits<char>_>,_SystemType,_EnumValue>_>
  *pvVar6;
  CustomAttributeSig local_48;
  
  winmd::reader::CustomAttribute::Value(&local_48,attribute);
  __v = &std::
         get<0ul,winmd::reader::ElemSig,std::vector<winmd::reader::ElemSig,std::allocator<winmd::reader::ElemSig>>>
                   (&local_48.m_fixed_args.
                     super__Vector_base<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_>
                     ._M_impl.super__Vector_impl_data._M_start[arg].value)->value;
  pvVar6 = std::
           get<14ul,bool,char16_t,unsigned_char,signed_char,unsigned_short,short,unsigned_int,int,unsigned_long,long,float,double,std::basic_string_view<char,std::char_traits<char>>,winmd::reader::ElemSig::SystemType,winmd::reader::ElemSig::EnumValue>
                     (__v);
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->value).
           super__Variant_base<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>
           .
           super__Move_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>
           .
           super__Copy_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>
           .
           super__Move_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>
           .
           super__Copy_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>
           .
           super__Variant_storage_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>
   + 8) = *(undefined8 *)
           ((long)&(pvVar6->value).
                   super__Variant_base<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>
                   .
                   super__Move_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>
                   .
                   super__Copy_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>
                   .
                   super__Move_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>
                   .
                   super__Copy_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>
                   .
                   super__Variant_storage_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>
           + 8);
  ptVar1 = (pvVar6->type).m_typedef.super_row_base<winmd::reader::TypeDef>.m_table;
  uVar4 = (pvVar6->type).m_typedef.super_row_base<winmd::reader::TypeDef>.m_index;
  uVar5 = *(undefined4 *)&(pvVar6->type).m_typedef.super_row_base<winmd::reader::TypeDef>.field_0xc;
  uVar3 = *(undefined7 *)&(pvVar6->type).field_0x11;
  uVar2 = (pvVar6->value).
          super__Variant_base<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>
          .
          super__Move_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>
          .
          super__Copy_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>
          .
          super__Move_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>
          .
          super__Copy_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>
          .
          super__Variant_storage_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>
          ._M_u;
  (__return_storage_ptr__->type).m_underlying_type = (pvVar6->type).m_underlying_type;
  *(undefined7 *)&(__return_storage_ptr__->type).field_0x11 = uVar3;
  (__return_storage_ptr__->value).
  super__Variant_base<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>
  .
  super__Move_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>
  .
  super__Copy_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>
  .
  super__Move_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>
  .
  super__Copy_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>
  .
  super__Variant_storage_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>
  ._M_u = (_Variadic_union<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>
           )uVar2;
  (__return_storage_ptr__->type).m_typedef.super_row_base<winmd::reader::TypeDef>.m_table = ptVar1;
  (__return_storage_ptr__->type).m_typedef.super_row_base<winmd::reader::TypeDef>.m_index = uVar4;
  *(undefined4 *)
   &(__return_storage_ptr__->type).m_typedef.super_row_base<winmd::reader::TypeDef>.field_0xc =
       uVar5;
  std::vector<winmd::reader::NamedArgSig,_std::allocator<winmd::reader::NamedArgSig>_>::~vector
            (&local_48.m_named_args);
  std::vector<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_>::~vector
            (&local_48.m_fixed_args);
  return __return_storage_ptr__;
}

Assistant:

auto get_attribute_value(CustomAttribute const& attribute, uint32_t const arg)
    {
        return get_attribute_value<T>(attribute.Value().FixedArgs()[arg]);
    }